

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

void __thiscall QMakeInternal::QMakeBuiltin::QMakeBuiltin(QMakeBuiltin *this,QMakeBuiltinInit *d)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  int arange;
  int dmax;
  int dmin;
  uint in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc74;
  byte bVar24;
  undefined1 in_stack_fffffffffffffc75;
  byte bVar25;
  undefined1 in_stack_fffffffffffffc76;
  byte bVar26;
  undefined1 in_stack_fffffffffffffc77;
  byte bVar27;
  undefined1 in_stack_fffffffffffffc78;
  byte bVar28;
  undefined1 in_stack_fffffffffffffc79;
  byte bVar29;
  undefined1 in_stack_fffffffffffffc7a;
  byte bVar30;
  undefined1 in_stack_fffffffffffffc7b;
  byte bVar31;
  undefined1 in_stack_fffffffffffffc7c;
  byte bVar32;
  undefined1 in_stack_fffffffffffffc7d;
  byte bVar33;
  undefined1 in_stack_fffffffffffffc7e;
  byte bVar34;
  undefined1 in_stack_fffffffffffffc7f;
  byte bVar35;
  undefined1 in_stack_fffffffffffffc80;
  byte bVar36;
  undefined1 in_stack_fffffffffffffc81;
  byte bVar37;
  undefined1 in_stack_fffffffffffffc82;
  byte bVar38;
  undefined1 in_stack_fffffffffffffc83;
  byte bVar39;
  undefined4 in_stack_fffffffffffffc84;
  int iVar40;
  QString *this_00;
  QString *in_stack_fffffffffffffca0;
  QString *in_stack_fffffffffffffca8;
  QString *in_stack_fffffffffffffcb0;
  QString *in_stack_fffffffffffffcb8;
  storage_type *local_338;
  undefined1 local_328 [24];
  storage_type *local_310;
  undefined1 local_300 [24];
  storage_type *local_2e8;
  undefined1 local_2d8 [24];
  storage_type *local_2c0;
  undefined1 local_2b0 [24];
  storage_type *local_298;
  undefined1 local_288 [24];
  storage_type *local_270;
  undefined1 local_260 [24];
  storage_type *local_248;
  undefined1 local_238 [24];
  storage_type *local_220;
  undefined1 local_210 [24];
  storage_type *local_1f8;
  undefined1 local_1e8 [24];
  storage_type *local_1d0;
  undefined1 local_1c0 [24];
  storage_type *local_1a8;
  undefined1 local_198 [24];
  storage_type *local_180;
  undefined1 local_170 [24];
  storage_type *local_158;
  undefined1 local_148 [24];
  storage_type *local_130;
  undefined1 local_120 [24];
  storage_type *local_108;
  undefined1 local_f8 [24];
  storage_type *local_e0;
  undefined1 local_d0 [48];
  storage_type *local_a0;
  undefined1 local_90 [24];
  storage_type *local_78;
  undefined1 local_68 [24];
  storage_type *local_50;
  undefined1 local_40 [52];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QString::QString((QString *)0x2c4874);
  *(undefined4 *)&in_RDI[1].d.d = *(undefined4 *)&(in_RSI->d).ptr;
  local_c = 0;
  piVar3 = qMax<int>(&local_c,(int *)((long)&(in_RSI->d).ptr + 4));
  *(int *)((long)&in_RDI[1].d.d + 4) = *piVar3;
  *(int *)&in_RDI[1].d.ptr = (int)(in_RSI->d).size;
  iVar1 = qAbs<int>((int *)((long)&(in_RSI->d).ptr + 4));
  iVar40 = (int)(in_RSI->d).size;
  if (iVar40 == 1000) {
    if (iVar1 == 1) {
      QByteArrayView::QByteArrayView<39ul>
                ((QByteArrayView *)
                 CONCAT44(in_stack_fffffffffffffc84,
                          CONCAT13(in_stack_fffffffffffffc83,
                                   CONCAT12(in_stack_fffffffffffffc82,
                                            CONCAT11(in_stack_fffffffffffffc81,
                                                     in_stack_fffffffffffffc80)))),
                 (char (*) [39])
                 CONCAT17(in_stack_fffffffffffffc7f,
                          CONCAT16(in_stack_fffffffffffffc7e,
                                   CONCAT15(in_stack_fffffffffffffc7d,
                                            CONCAT14(in_stack_fffffffffffffc7c,
                                                     CONCAT13(in_stack_fffffffffffffc7b,
                                                              CONCAT12(in_stack_fffffffffffffc7a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffc79,
                                                  in_stack_fffffffffffffc78))))))));
      QVar4.m_data = local_50;
      QVar4.m_size = (qsizetype)local_40;
      QString::fromLatin1(QVar4);
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)
                 CONCAT44(in_stack_fffffffffffffc84,
                          CONCAT13(in_stack_fffffffffffffc83,
                                   CONCAT12(in_stack_fffffffffffffc82,
                                            CONCAT11(in_stack_fffffffffffffc81,
                                                     in_stack_fffffffffffffc80)))),
                 (char **)CONCAT17(in_stack_fffffffffffffc7f,
                                   CONCAT16(in_stack_fffffffffffffc7e,
                                            CONCAT15(in_stack_fffffffffffffc7d,
                                                     CONCAT14(in_stack_fffffffffffffc7c,
                                                              CONCAT13(in_stack_fffffffffffffc7b,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffc7a,
                                                  CONCAT11(in_stack_fffffffffffffc79,
                                                           in_stack_fffffffffffffc78))))))));
      QVar5.m_data = local_78;
      QVar5.m_size = (qsizetype)local_68;
      QString::fromLatin1(QVar5);
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)
                 CONCAT44(in_stack_fffffffffffffc84,
                          CONCAT13(in_stack_fffffffffffffc83,
                                   CONCAT12(in_stack_fffffffffffffc82,
                                            CONCAT11(in_stack_fffffffffffffc81,
                                                     in_stack_fffffffffffffc80)))),
                 (char **)CONCAT17(in_stack_fffffffffffffc7f,
                                   CONCAT16(in_stack_fffffffffffffc7e,
                                            CONCAT15(in_stack_fffffffffffffc7d,
                                                     CONCAT14(in_stack_fffffffffffffc7c,
                                                              CONCAT13(in_stack_fffffffffffffc7b,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffc7a,
                                                  CONCAT11(in_stack_fffffffffffffc79,
                                                           in_stack_fffffffffffffc78))))))));
      QVar6.m_data = local_a0;
      QVar6.m_size = (qsizetype)local_90;
      QString::fromLatin1(QVar6);
      QString::arg<QString,QString>(this_00,in_RSI,(QString *)CONCAT44(iVar1,iVar40));
      QString::operator=((QString *)
                         CONCAT17(in_stack_fffffffffffffc77,
                                  CONCAT16(in_stack_fffffffffffffc76,
                                           CONCAT15(in_stack_fffffffffffffc75,
                                                    CONCAT14(in_stack_fffffffffffffc74,
                                                             in_stack_fffffffffffffc70)))),in_RDI);
      QString::~QString((QString *)0x2c49c8);
      QString::~QString((QString *)0x2c49d5);
      QString::~QString((QString *)0x2c49e2);
      QString::~QString((QString *)0x2c49ef);
    }
  }
  else {
    uVar2 = iVar40 - iVar1;
    bVar39 = 0;
    bVar38 = 0;
    bVar37 = 0;
    bVar36 = 0;
    bVar35 = 0;
    bVar34 = 0;
    bVar33 = 0;
    bVar32 = 0;
    bVar31 = 0;
    bVar30 = 0;
    bVar29 = 0;
    bVar28 = 0;
    bVar27 = 0;
    bVar26 = 0;
    bVar25 = 0;
    bVar24 = 0;
    in_stack_fffffffffffffc70 = in_stack_fffffffffffffc70 & 0xffffff;
    if ((int)uVar2 < 2) {
      if ((int)uVar2 < 1) {
        if (iVar40 == 1) {
          QByteArrayView::QByteArrayView<30ul>
                    ((QByteArrayView *)((ulong)uVar2 << 0x20),(char (*) [30])0x0);
          QVar21.m_data = local_310;
          QVar21.m_size = (qsizetype)local_300;
          QString::fromLatin1(QVar21);
          bVar25 = 1;
          QByteArrayView::QByteArrayView<const_char_*,_true>
                    ((QByteArrayView *)
                     CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                     (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,
                                                  CONCAT13(bVar31,CONCAT12(bVar30,CONCAT11(bVar29,
                                                  bVar28))))))));
          QVar22.m_data = local_338;
          QVar22.m_size = (qsizetype)local_328;
          QString::fromLatin1(QVar22);
          bVar24 = 1;
          QByteArrayView::QByteArrayView<const_char_*,_true>
                    ((QByteArrayView *)
                     CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                     (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,
                                                  CONCAT13(bVar31,CONCAT12(bVar30,CONCAT11(bVar29,
                                                  bVar28))))))));
          QVar23.m_data = (storage_type *)in_stack_fffffffffffffca0;
          QVar23.m_size = (qsizetype)&stack0xfffffffffffffcb0;
          QString::fromLatin1(QVar23);
          in_stack_fffffffffffffc70 = CONCAT13(1,(int3)in_stack_fffffffffffffc70);
          QString::arg<QString,QString>(this_00,in_RSI,(QString *)CONCAT44(iVar1,iVar40));
        }
        else {
          QByteArrayView::QByteArrayView<30ul>
                    ((QByteArrayView *)((ulong)uVar2 << 0x20),(char (*) [30])0x0);
          QVar17.m_data = local_270;
          QVar17.m_size = (qsizetype)local_260;
          QString::fromLatin1(QVar17);
          bVar29 = 1;
          QByteArrayView::QByteArrayView<const_char_*,_true>
                    ((QByteArrayView *)
                     CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                     (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,
                                                  CONCAT13(bVar31,CONCAT12(bVar30,CONCAT11(1,bVar28)
                                                                          )))))));
          QVar18.m_data = local_298;
          QVar18.m_size = (qsizetype)local_288;
          QString::fromLatin1(QVar18);
          bVar28 = 1;
          QByteArrayView::QByteArrayView<const_char_*,_true>
                    ((QByteArrayView *)
                     CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                     (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,
                                                  CONCAT13(bVar31,CONCAT12(bVar30,CONCAT11(bVar29,1)
                                                                          )))))));
          QVar19.m_data = local_2c0;
          QVar19.m_size = (qsizetype)local_2b0;
          QString::fromLatin1(QVar19);
          bVar27 = 1;
          QByteArrayView::QByteArrayView<const_char_*,_true>
                    ((QByteArrayView *)
                     CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                     (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,
                                                  CONCAT13(bVar31,CONCAT12(bVar30,CONCAT11(bVar29,
                                                  bVar28))))))));
          QVar20.m_data = local_2e8;
          QVar20.m_size = (qsizetype)local_2d8;
          QString::fromLatin1(QVar20);
          bVar26 = 1;
          QString::arg<QString,QString,QString>
                    (in_stack_fffffffffffffca0,this_00,in_RSI,(QString *)CONCAT44(iVar1,iVar40));
        }
      }
      else {
        QByteArrayView::QByteArrayView<36ul>
                  ((QByteArrayView *)((ulong)uVar2 << 0x20),(char (*) [36])0x0);
        QVar12.m_data = local_1a8;
        QVar12.m_size = (qsizetype)local_198;
        QString::fromLatin1(QVar12);
        bVar34 = 1;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)
                   CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                   (char **)CONCAT17(bVar35,CONCAT16(1,CONCAT15(bVar33,CONCAT14(bVar32,CONCAT13(
                                                  bVar31,CONCAT12(bVar30,CONCAT11(bVar29,bVar28)))))
                                                  )));
        QVar13.m_data = local_1d0;
        QVar13.m_size = (qsizetype)local_1c0;
        QString::fromLatin1(QVar13);
        bVar33 = 1;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)
                   CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                   (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(1,CONCAT14(bVar32,CONCAT13(
                                                  bVar31,CONCAT12(bVar30,CONCAT11(bVar29,bVar28)))))
                                                  )));
        QVar14.m_data = local_1f8;
        QVar14.m_size = (qsizetype)local_1e8;
        QString::fromLatin1(QVar14);
        bVar32 = 1;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)
                   CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                   (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(1,CONCAT13(
                                                  bVar31,CONCAT12(bVar30,CONCAT11(bVar29,bVar28)))))
                                                  )));
        QVar15.m_data = local_220;
        QVar15.m_size = (qsizetype)local_210;
        QString::fromLatin1(QVar15);
        bVar31 = 1;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)
                   CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                   (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,CONCAT13
                                                  (1,CONCAT12(bVar30,CONCAT11(bVar29,bVar28))))))));
        QVar16.m_data = local_248;
        QVar16.m_size = (qsizetype)local_238;
        QString::fromLatin1(QVar16);
        bVar30 = 1;
        QString::arg<QString,QString,QString,QString>
                  (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                   in_stack_fffffffffffffca0,this_00);
      }
    }
    else {
      QByteArrayView::QByteArrayView<36ul>
                ((QByteArrayView *)((ulong)uVar2 << 0x20),(char (*) [36])0x0);
      QVar7.m_data = local_e0;
      QVar7.m_size = (qsizetype)local_d0;
      QString::fromLatin1(QVar7);
      bVar39 = 1;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)
                 CONCAT44(uVar2,CONCAT13(1,CONCAT12(bVar38,CONCAT11(bVar37,bVar36)))),
                 (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,CONCAT13(
                                                  bVar31,CONCAT12(bVar30,CONCAT11(bVar29,bVar28)))))
                                                  )));
      QVar8.m_data = local_108;
      QVar8.m_size = (qsizetype)local_f8;
      QString::fromLatin1(QVar8);
      bVar38 = 1;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)
                 CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(1,CONCAT11(bVar37,bVar36)))),
                 (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,CONCAT13(
                                                  bVar31,CONCAT12(bVar30,CONCAT11(bVar29,bVar28)))))
                                                  )));
      QVar9.m_data = local_130;
      QVar9.m_size = (qsizetype)local_120;
      QString::fromLatin1(QVar9);
      bVar37 = 1;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)
                 CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(1,bVar36)))),
                 (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,CONCAT13(
                                                  bVar31,CONCAT12(bVar30,CONCAT11(bVar29,bVar28)))))
                                                  )));
      QVar10.m_data = local_158;
      QVar10.m_size = (qsizetype)local_148;
      QString::fromLatin1(QVar10);
      bVar36 = 1;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)
                 CONCAT44(uVar2,CONCAT13(bVar39,CONCAT12(bVar38,CONCAT11(bVar37,1)))),
                 (char **)CONCAT17(bVar35,CONCAT16(bVar34,CONCAT15(bVar33,CONCAT14(bVar32,CONCAT13(
                                                  bVar31,CONCAT12(bVar30,CONCAT11(bVar29,bVar28)))))
                                                  )));
      QVar11.m_data = local_180;
      QVar11.m_size = (qsizetype)local_170;
      QString::fromLatin1(QVar11);
      bVar35 = 1;
      QString::arg<QString,QString,QString,QString>
                (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca0,this_00);
    }
    QString::operator=((QString *)
                       CONCAT17(bVar27,CONCAT16(bVar26,CONCAT15(bVar25,CONCAT14(bVar24,
                                                  in_stack_fffffffffffffc70)))),in_RDI);
    QString::~QString((QString *)0x2c4f19);
    if ((in_stack_fffffffffffffc70 & 0x1000000) != 0) {
      QString::~QString((QString *)0x2c4f2c);
    }
    if ((bVar24 & 1) != 0) {
      QString::~QString((QString *)0x2c4f3f);
    }
    if ((bVar25 & 1) != 0) {
      QString::~QString((QString *)0x2c4f55);
    }
    if ((bVar26 & 1) != 0) {
      QString::~QString((QString *)0x2c4f6b);
    }
    if ((bVar27 & 1) != 0) {
      QString::~QString((QString *)0x2c4f81);
    }
    if ((bVar28 & 1) != 0) {
      QString::~QString((QString *)0x2c4f97);
    }
    if ((bVar29 & 1) != 0) {
      QString::~QString((QString *)0x2c4fad);
    }
    if ((bVar30 & 1) != 0) {
      QString::~QString((QString *)0x2c4fc3);
    }
    if ((bVar31 & 1) != 0) {
      QString::~QString((QString *)0x2c4fd9);
    }
    if ((bVar32 & 1) != 0) {
      QString::~QString((QString *)0x2c4fef);
    }
    if ((bVar33 & 1) != 0) {
      QString::~QString((QString *)0x2c5005);
    }
    if ((bVar34 & 1) != 0) {
      QString::~QString((QString *)0x2c501b);
    }
    if ((bVar35 & 1) != 0) {
      QString::~QString((QString *)0x2c5031);
    }
    if ((bVar36 & 1) != 0) {
      QString::~QString((QString *)0x2c5047);
    }
    if ((bVar37 & 1) != 0) {
      QString::~QString((QString *)0x2c505d);
    }
    if ((bVar38 & 1) != 0) {
      QString::~QString((QString *)0x2c5073);
    }
    if ((bVar39 & 1) != 0) {
      QString::~QString((QString *)0x2c5089);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMakeBuiltin::QMakeBuiltin(const QMakeBuiltinInit &d)
    : index(d.func), minArgs(qMax(0, d.min_args)), maxArgs(d.max_args)
{
    static const char * const nstr[6] = { "no", "one", "two", "three", "four", "five" };
    // For legacy reasons, there is actually no such thing as "no arguments"
    // - there is only "empty first argument", which needs to be mapped back.
    // -1 means "one, which may be empty", which is effectively zero, except
    // for the error message if there are too many arguments.
    int dmin = qAbs(d.min_args);
    int dmax = d.max_args;
    if (dmax == QMakeBuiltinInit::VarArgs) {
        Q_ASSERT_X(dmin < 2, "init", d.name);
        if (dmin == 1) {
            Q_ASSERT_X(d.args != nullptr, "init", d.name);
            usage = fL1S("%1(%2) requires at least one argument.")
                    .arg(fL1S(d.name), fL1S(d.args));
        }
        return;
    }
    int arange = dmax - dmin;
    Q_ASSERT_X(arange >= 0, "init", d.name);
    Q_ASSERT_X(d.args != nullptr, "init", d.name);
    usage = arange > 1
               ? fL1S("%1(%2) requires %3 to %4 arguments.")
                 .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmin]), fL1S(nstr[dmax]))
               : arange > 0
                   ? fL1S("%1(%2) requires %3 or %4 arguments.")
                     .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmin]), fL1S(nstr[dmax]))
                   : dmax != 1
                       ? fL1S("%1(%2) requires %3 arguments.")
                         .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmax]))
                       : fL1S("%1(%2) requires one argument.")
                         .arg(fL1S(d.name), fL1S(d.args));
}